

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

Vec3fa __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::computeDirection(CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
                   *this,uint primID,size_t time)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  RefCount RVar8;
  long in_RCX;
  undefined4 in_register_00000034;
  Vec3fa *axis1;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vec3fa VVar14;
  
  lVar3 = *(long *)(CONCAT44(in_register_00000034,primID) + 0x188);
  uVar2 = *(uint *)(*(long *)(CONCAT44(in_register_00000034,primID) + 0x58) +
                   (time & 0xffffffff) * *(long *)(CONCAT44(in_register_00000034,primID) + 0x68));
  lVar4 = *(long *)(lVar3 + in_RCX * 0x38);
  lVar3 = *(long *)(lVar3 + 0x10 + in_RCX * 0x38);
  lVar9 = (ulong)(uVar2 + 1) * lVar3;
  lVar10 = (ulong)(uVar2 + 2) * lVar3;
  lVar11 = (ulong)(uVar2 + 3) * lVar3;
  fVar1 = *(float *)(CONCAT44(in_register_00000034,primID) + 0x24c);
  auVar13 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + (ulong)uVar2 * lVar3),
                          ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + (ulong)uVar2 * lVar3))),
                          0x30);
  auVar5 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar9),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar9))),0x30);
  auVar6 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar10),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar10))),0x30);
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])(lVar4 + lVar11),
                         ZEXT416((uint)(fVar1 * *(float *)(lVar4 + 0xc + lVar11))),0x30);
  auVar12._0_4_ = auVar13._0_4_ * 0.16666667 + auVar5._0_4_ * 0.6666667 + auVar6._0_4_ * 0.16666667;
  auVar12._4_4_ = auVar13._4_4_ * 0.16666667 + auVar5._4_4_ * 0.6666667 + auVar6._4_4_ * 0.16666667;
  auVar12._8_4_ = auVar13._8_4_ * 0.16666667 + auVar5._8_4_ * 0.6666667 + auVar6._8_4_ * 0.16666667;
  auVar12._12_4_ =
       auVar13._12_4_ * 0.16666667 + auVar5._12_4_ * 0.6666667 + auVar6._12_4_ * 0.16666667;
  auVar13._0_8_ =
       CONCAT44(auVar5._4_4_ * 0.16666667 + auVar6._4_4_ * 0.6666667 + auVar7._4_4_ * 0.16666667,
                auVar5._0_4_ * 0.16666667 + auVar6._0_4_ * 0.6666667 + auVar7._0_4_ * 0.16666667);
  auVar13._8_4_ = auVar5._8_4_ * 0.16666667 + auVar6._8_4_ * 0.6666667 + auVar7._8_4_ * 0.16666667;
  auVar13._12_4_ =
       auVar5._12_4_ * 0.16666667 + auVar6._12_4_ * 0.6666667 + auVar7._12_4_ * 0.16666667;
  RVar8 = (RefCount)vsubps_avx(auVar13,auVar12);
  (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.super_Geometry.
  super_RefCount = RVar8;
  VVar14.field_0._0_8_ = RVar8._vptr_RefCount;
  VVar14.field_0._8_8_ = auVar13._0_8_;
  return (Vec3fa)VVar14.field_0;
}

Assistant:

Vec3fa computeDirection(unsigned int primID, size_t time) const
      {
        const Curve3ff c = getCurveScaledRadius(primID,time);
        const Vec3fa p0 = c.begin();
        const Vec3fa p3 = c.end();
        const Vec3fa axis1 = p3 - p0;
        return axis1;
      }